

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_act.c
# Opt level: O1

bool redit_rlist(CHAR_DATA *ch,char *argument)

{
  AREA_DATA_conflict *pAVar1;
  int iVar2;
  BUFFER *buffer;
  ROOM_INDEX_DATA *pRVar3;
  char *pcVar4;
  int iVar5;
  bool bVar6;
  uint uVar7;
  bool bVar8;
  char arg [4608];
  char buf [4608];
  char local_2438 [4608];
  char local_1238 [4616];
  
  one_argument(argument,local_2438);
  pAVar1 = ch->in_room->area;
  buffer = new_buf();
  bVar6 = false;
  if (pAVar1->max_vnum < pAVar1->min_vnum) {
    bVar8 = true;
  }
  else {
    iVar5 = 0;
    bVar6 = false;
    uVar7 = (int)pAVar1->min_vnum;
    do {
      pRVar3 = get_room_index(0);
      if (pRVar3 != (ROOM_INDEX_DATA *)0x0) {
        pcVar4 = capitalize(pRVar3->name);
        sprintf(local_1238,"[%5d] %-17.16s",(ulong)uVar7,pcVar4);
        add_buf(buffer,local_1238);
        iVar2 = iVar5 * -0x55555555;
        iVar5 = iVar5 + 1;
        bVar6 = true;
        if (iVar2 + 0xd5555555U < 0x55555555) {
          add_buf(buffer,"\n\r");
        }
      }
      bVar8 = (int)uVar7 < (int)pAVar1->max_vnum;
      uVar7 = uVar7 + 1;
    } while (bVar8);
    bVar8 = iVar5 * -0x55555555 + 0x2aaaaaaaU < 0x55555555;
  }
  if (bVar6) {
    if (!bVar8) {
      add_buf(buffer,"\n\r");
    }
    pcVar4 = buf_string(buffer);
    page_to_char(pcVar4,ch);
    free_buf(buffer);
  }
  else {
    send_to_char("Room(s) not found in this area.\n\r",ch);
  }
  return false;
}

Assistant:

bool redit_rlist(CHAR_DATA *ch, char *argument)
{
	ROOM_INDEX_DATA *pRoomIndex;
	AREA_DATA *pArea;
	char buf[MAX_STRING_LENGTH];
	BUFFER *buf1;
	char arg[MAX_INPUT_LENGTH];
	bool found;
	int vnum;
	int col = 0;

	one_argument(argument, arg);

	pArea = ch->in_room->area;
	buf1 = new_buf();
	/*    buf1[0] = '\0'; */
	found = false;

	for (vnum = pArea->min_vnum; vnum <= pArea->max_vnum; vnum++)
	{
		pRoomIndex = get_room_index(vnum);
		if (pRoomIndex)
		{
			found = true;

			sprintf(buf, "[%5d] %-17.16s", vnum, capitalize(pRoomIndex->name));
			add_buf(buf1, buf);

			if (++col % 3 == 0)
				add_buf(buf1, "\n\r");
		}
	}

	if (!found)
	{
		send_to_char("Room(s) not found in this area.\n\r", ch);
		return false;
	}

	if (col % 3 != 0)
		add_buf(buf1, "\n\r");

	page_to_char(buf_string(buf1), ch);
	free_buf(buf1);
	return false;
}